

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQClass *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  SQObjectPtr *pSVar7;
  bool bVar8;
  SQObjectPtr *key;
  SQObjectPtr *val;
  SQRESULT SVar9;
  SQObjectPtr attrs;
  SQObjectPtr *o;
  SQObjectPtr local_38;
  SQObjectPtr *local_28;
  
  local_28 = (SQObjectPtr *)0x0;
  bVar8 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_28);
  if (!bVar8) {
    return -1;
  }
  key = SQVM::GetUp(v,-2);
  val = SQVM::GetUp(v,-1);
  pSVar7 = local_28;
  local_38.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  pSVar4 = (local_28->super_SQObject)._unVal.pClass;
  if ((key->super_SQObject)._type == OT_NULL) {
    local_38.super_SQObject._unVal =
         (SQObjectValue)(pSVar4->_attributes).super_SQObject._unVal.pTable;
    local_38.super_SQObject._type = (pSVar4->_attributes).super_SQObject._type;
    if ((local_38.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_38.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    pSVar4 = (local_28->super_SQObject)._unVal.pClass;
    SVar2 = (pSVar4->_attributes).super_SQObject._type;
    pSVar5 = (pSVar4->_attributes).super_SQObject._unVal.pTable;
    pSVar6 = (val->super_SQObject)._unVal.pTable;
    (pSVar4->_attributes).super_SQObject._unVal.pTable = pSVar6;
    SVar3 = (val->super_SQObject)._type;
    (pSVar4->_attributes).super_SQObject._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  else {
    bVar8 = SQClass::GetAttributes(pSVar4,key,&local_38);
    if (!bVar8) {
      SVar9 = -1;
      sq_throwerror(v,"wrong index");
      goto LAB_0011435f;
    }
    SQClass::SetAttributes((pSVar7->super_SQObject)._unVal.pClass,key,val);
  }
  SQVM::Pop(v,2);
  SQVM::Push(v,&local_38);
  SVar9 = 0;
LAB_0011435f:
  SQObjectPtr::~SQObjectPtr(&local_38);
  return SVar9;
}

Assistant:

SQRESULT sq_setattributes(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    SQObjectPtr &key = stack_get(v,-2);
    SQObjectPtr &val = stack_get(v,-1);
    SQObjectPtr attrs;
    if(type(key) == OT_NULL) {
        attrs = _class(*o)->_attributes;
        _class(*o)->_attributes = val;
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }else if(_class(*o)->GetAttributes(key,attrs)) {
        _class(*o)->SetAttributes(key,val);
        v->Pop(2);
        v->Push(attrs);
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong index"));
}